

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O1

bool __thiscall
CoreML::Specification::TreeEnsembleClassifier::MergePartialFromCodedStream
          (TreeEnsembleClassifier *this,CodedInputStream *input)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  uint8 *puVar4;
  bool bVar5;
  uint uVar6;
  uint32 uVar7;
  long in_RAX;
  Int64Vector *pIVar8;
  TreeEnsembleParameters *pTVar9;
  StringVector *pSVar10;
  pair<int,_int> pVar11;
  int iVar12;
  char cVar13;
  int iVar14;
  ulong uVar15;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  do {
    pbVar3 = input->buffer_;
    uVar7 = 0;
    if (pbVar3 < input->buffer_end_) {
      bVar2 = *pbVar3;
      uVar15 = (ulong)bVar2;
      pbVar1 = pbVar3 + 1;
      uVar6 = (uint)bVar2;
      if ((char)bVar2 < '\x01') {
        uVar7 = (uint)bVar2;
        if ((input->buffer_end_ <= pbVar1) || (uVar7 = uVar6, (~(uint)*pbVar1 & uVar6) < 0x80))
        goto LAB_0025d2ac;
        uVar15 = (ulong)((uVar6 + (uint)*pbVar1 * 0x80) - 0x80);
        input->buffer_ = pbVar3 + 2;
      }
      else {
        input->buffer_ = pbVar1;
      }
      uVar15 = uVar15 | 0x100000000;
    }
    else {
LAB_0025d2ac:
      uVar7 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar7);
      uVar15 = 0;
      if (uVar7 - 1 < 0x3fff) {
        uVar15 = 0x100000000;
      }
      uVar15 = uVar7 | uVar15;
    }
    uVar7 = (uint32)uVar15;
    if ((uVar15 & 0x100000000) == 0) goto LAB_0025d03c;
    uVar6 = (uint)(uVar15 >> 3) & 0x1fffffff;
    cVar13 = (char)uVar15;
    if (uVar6 < 100) {
      if (uVar6 == 1) {
        if (cVar13 == '\n') {
          if (this->treeensemble_ == (TreeEnsembleParameters *)0x0) {
            pTVar9 = (TreeEnsembleParameters *)operator_new(0x50);
            TreeEnsembleParameters::TreeEnsembleParameters(pTVar9);
            this->treeensemble_ = pTVar9;
          }
          pTVar9 = this->treeensemble_;
          puVar4 = input->buffer_;
          if ((puVar4 < input->buffer_end_) && (iVar14 = (int)(char)*puVar4, -1 < (char)*puVar4)) {
            input->buffer_ = puVar4 + 1;
            bVar5 = true;
          }
          else {
            iVar14 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
            bVar5 = -1 < iVar14;
          }
          iVar12 = 6;
          if ((bVar5) &&
             (pVar11 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                                 (input,iVar14), -1 < (long)pVar11)) {
            bVar5 = TreeEnsembleParameters::MergePartialFromCodedStream(pTVar9,input);
            goto LAB_0025d28c;
          }
          goto LAB_0025d067;
        }
LAB_0025d03c:
        iVar12 = 7;
        if ((uVar7 & 7) != 4 && uVar7 != 0) {
          bVar5 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar7);
          if (bVar5) goto LAB_0025d065;
          iVar12 = 6;
        }
      }
      else {
        if ((uVar6 != 2) || (cVar13 != '\x10')) goto LAB_0025d03c;
        pbVar3 = input->buffer_;
        if (pbVar3 < input->buffer_end_) {
          bVar2 = *pbVar3;
          uVar15 = (ulong)bVar2;
          uVar7 = (uint32)bVar2;
          if ((char)bVar2 < '\0') goto LAB_0025d2dc;
          input->buffer_ = pbVar3 + 1;
          bVar5 = true;
        }
        else {
          uVar7 = 0;
LAB_0025d2dc:
          uVar15 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar7);
          bVar5 = -1 < (long)uVar15;
        }
        uVar6 = uStack_38._4_4_;
        if (bVar5) {
          uVar6 = (uint)uVar15;
        }
        uStack_38 = (ulong)uVar6 << 0x20;
        if (!bVar5) {
          iVar12 = 6;
          goto LAB_0025d067;
        }
        this->postevaluationtransform_ = uVar6;
LAB_0025d065:
        iVar12 = 0;
      }
    }
    else {
      if (uVar6 == 100) {
        if (cVar13 == '\"') {
          if (this->_oneof_case_[0] != 100) {
            clear_ClassLabels(this);
            this->_oneof_case_[0] = 100;
            pSVar10 = (StringVector *)operator_new(0x30);
            StringVector::StringVector(pSVar10);
            (this->ClassLabels_).stringclasslabels_ = pSVar10;
          }
          pSVar10 = (this->ClassLabels_).stringclasslabels_;
          puVar4 = input->buffer_;
          if ((puVar4 < input->buffer_end_) && (iVar14 = (int)(char)*puVar4, -1 < (char)*puVar4)) {
            input->buffer_ = puVar4 + 1;
            bVar5 = true;
          }
          else {
            iVar14 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
            bVar5 = -1 < iVar14;
          }
          iVar12 = 6;
          if ((bVar5) &&
             (pVar11 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                                 (input,iVar14), -1 < (long)pVar11)) {
            bVar5 = StringVector::MergePartialFromCodedStream(pSVar10,input);
            goto LAB_0025d28c;
          }
          goto LAB_0025d067;
        }
        goto LAB_0025d03c;
      }
      if ((uVar6 != 0x65) || (cVar13 != '*')) goto LAB_0025d03c;
      if (this->_oneof_case_[0] != 0x65) {
        clear_ClassLabels(this);
        this->_oneof_case_[0] = 0x65;
        pIVar8 = (Int64Vector *)operator_new(0x28);
        Int64Vector::Int64Vector(pIVar8);
        (this->ClassLabels_).int64classlabels_ = pIVar8;
      }
      pIVar8 = (this->ClassLabels_).int64classlabels_;
      puVar4 = input->buffer_;
      if ((puVar4 < input->buffer_end_) && (iVar14 = (int)(char)*puVar4, -1 < (char)*puVar4)) {
        input->buffer_ = puVar4 + 1;
        bVar5 = true;
      }
      else {
        iVar14 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        bVar5 = -1 < iVar14;
      }
      iVar12 = 6;
      if ((bVar5) &&
         (pVar11 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                             (input,iVar14), -1 < (long)pVar11)) {
        bVar5 = Int64Vector::MergePartialFromCodedStream(pIVar8,input);
LAB_0025d28c:
        iVar12 = 6;
        if ((bVar5 != false) &&
           (bVar5 = google::protobuf::io::CodedInputStream::DecrementRecursionDepthAndPopLimit
                              (input,pVar11.first), bVar5)) goto LAB_0025d065;
      }
    }
LAB_0025d067:
    if (iVar12 != 0) {
      return iVar12 != 6;
    }
  } while( true );
}

Assistant:

bool TreeEnsembleClassifier::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.TreeEnsembleClassifier)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // .CoreML.Specification.TreeEnsembleParameters treeEnsemble = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_treeensemble()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.TreeEnsemblePostEvaluationTransform postEvaluationTransform = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          set_postevaluationtransform(static_cast< ::CoreML::Specification::TreeEnsemblePostEvaluationTransform >(value));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.StringVector stringClassLabels = 100;
      case 100: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(802u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_stringclasslabels()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.Int64Vector int64ClassLabels = 101;
      case 101: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(810u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_int64classlabels()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.TreeEnsembleClassifier)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.TreeEnsembleClassifier)
  return false;
#undef DO_
}